

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CS248::DynamicScene::Scene::visualizeShadowMap(Scene *this)

{
  Shader *pSVar1;
  socklen_t in_ECX;
  sockaddr *__addr;
  allocator local_41;
  string local_40;
  long *local_20;
  GLResourceManager *local_18;
  
  std::__cxx11::string::string((string *)&local_40,"pre viz shadow map",(allocator *)&local_20);
  checkGLError(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  GLResourceManager::bindVertexArray
            ((GLResourceManager *)&local_20,(VertexArrayId)(GLuint)this->gl_mgr_);
  Shader::bind((Shader *)&stack0xffffffffffffffe8,(int)this->shadowVizShader_,__addr,in_ECX);
  pSVar1 = this->shadowVizShader_;
  std::__cxx11::string::string((string *)&local_40,"vtx_position",&local_41);
  Shader::setVertexBuffer(pSVar1,&local_40,3,(VertexBufferId)(this->shadowVizVtxBufferId_).id);
  std::__cxx11::string::~string((string *)&local_40);
  pSVar1 = this->shadowVizShader_;
  std::__cxx11::string::string((string *)&local_40,"vtx_texcoord",&local_41);
  Shader::setVertexBuffer(pSVar1,&local_40,2,(VertexBufferId)(this->shadowVizTexCoordBufferId_).id);
  std::__cxx11::string::~string((string *)&local_40);
  pSVar1 = this->shadowVizShader_;
  std::__cxx11::string::string((string *)&local_40,"depthTextureArray",&local_41);
  Shader::setTextureArraySampler
            (pSVar1,&local_40,(TextureArrayId)(this->shadowDepthTextureArrayId_).id);
  std::__cxx11::string::~string((string *)&local_40);
  pSVar1 = this->shadowVizShader_;
  std::__cxx11::string::string((string *)&local_40,"colorTextureArray",&local_41);
  Shader::setTextureArraySampler
            (pSVar1,&local_40,(TextureArrayId)(this->shadowColorTextureArrayId_).id);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"before glDrawArrays for shadow viz",&local_41);
  checkGLError(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  glDrawArrays(4,0,6);
  std::__cxx11::string::string((string *)&local_40,"post viz shadow map",&local_41);
  checkGLError(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_18 != (GLResourceManager *)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return;
}

Assistant:

void Scene::visualizeShadowMap() {
    checkGLError("pre viz shadow map");

    auto vertex_array_bind = gl_mgr_->bindVertexArray(shadowVizVertexArrayId_);
    auto shader_bind = shadowVizShader_->bind();
    shadowVizShader_->setVertexBuffer("vtx_position", 3, shadowVizVtxBufferId_);
    shadowVizShader_->setVertexBuffer("vtx_texcoord", 2, shadowVizTexCoordBufferId_);
    shadowVizShader_->setTextureArraySampler("depthTextureArray", shadowDepthTextureArrayId_);
    shadowVizShader_->setTextureArraySampler("colorTextureArray", shadowColorTextureArrayId_);
    // now issue the draw command to OpenGL
    checkGLError("before glDrawArrays for shadow viz");
    // 6 indices, 2 triangles to render
    glDrawArrays(GL_TRIANGLES, /*first=*/0, /*count=*/6);

    checkGLError("post viz shadow map");
}